

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

ExprList * sqlite3ExprListDup(sqlite3 *db,ExprList *p,int flags)

{
  byte *pbVar1;
  Expr *pEVar2;
  uint uVar3;
  ExprList *pEVar4;
  Expr *pEVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  Expr *local_48;
  Expr *local_40;
  
  if (p == (ExprList *)0x0) {
    return (ExprList *)0x0;
  }
  if ((db != (sqlite3 *)0x0) && (p < (ExprList *)(db->lookaside).pTrueEnd)) {
    uVar3 = 0x80;
    if ((ExprList *)(db->lookaside).pMiddle <= p) goto LAB_0018a951;
    if ((ExprList *)(db->lookaside).pStart <= p) {
      uVar3 = (uint)(db->lookaside).szTrue;
      goto LAB_0018a951;
    }
  }
  uVar3 = (*sqlite3Config.m.xSize)(p);
LAB_0018a951:
  pEVar4 = (ExprList *)sqlite3DbMallocRawNN(db,(long)(int)uVar3);
  if (pEVar4 == (ExprList *)0x0) {
    return (ExprList *)0x0;
  }
  pEVar4->nExpr = p->nExpr;
  pEVar4->nAlloc = p->nAlloc;
  if (0 < p->nExpr) {
    local_40 = (Expr *)0x0;
    lVar7 = 8;
    local_48 = (Expr *)0x0;
    iVar8 = 0;
    do {
      pEVar2 = *(Expr **)((long)p->a + lVar7 + -8);
      if (pEVar2 == (Expr *)0x0) {
        pEVar5 = (Expr *)0x0;
      }
      else {
        pEVar5 = exprDup(db,pEVar2,flags,(u8 **)0x0);
      }
      *(Expr **)((long)pEVar4->a + lVar7 + -8) = pEVar5;
      if ((pEVar2 != (Expr *)0x0) && (pEVar5 != (Expr *)0x0 && pEVar2->op == 0xb2)) {
        if (pEVar5->pRight == (Expr *)0x0) {
          pEVar2 = pEVar2->pLeft;
          if (pEVar2 != local_48) {
            if (pEVar2 == (Expr *)0x0) {
              local_40 = (Expr *)0x0;
            }
            else {
              local_40 = exprDup(db,pEVar2,flags,(u8 **)0x0);
            }
            pEVar5->pRight = local_40;
            local_48 = pEVar2;
          }
        }
        else {
          local_40 = pEVar5->pRight;
          local_48 = pEVar2->pRight;
        }
        pEVar5->pLeft = local_40;
      }
      pcVar6 = sqlite3DbStrDup(db,*(char **)((long)&p->a[0].pExpr + lVar7));
      *(char **)((long)&pEVar4->a[0].pExpr + lVar7) = pcVar6;
      *(undefined4 *)((long)&pEVar4->a[0].zEName + lVar7) =
           *(undefined4 *)((long)&p->a[0].zEName + lVar7);
      pbVar1 = (byte *)((long)&pEVar4->a[0].zEName + lVar7 + 1);
      *pbVar1 = *pbVar1 & 0xfb;
      *(undefined4 *)((long)&pEVar4->a[0].zEName + lVar7 + 4) =
           *(undefined4 *)((long)&p->a[0].zEName + lVar7 + 4);
      iVar8 = iVar8 + 1;
      lVar7 = lVar7 + 0x18;
    } while (iVar8 < p->nExpr);
    return pEVar4;
  }
  return pEVar4;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListDup(sqlite3 *db, const ExprList *p, int flags){
  ExprList *pNew;
  struct ExprList_item *pItem;
  const struct ExprList_item *pOldItem;
  int i;
  Expr *pPriorSelectColOld = 0;
  Expr *pPriorSelectColNew = 0;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, sqlite3DbMallocSize(db, p));
  if( pNew==0 ) return 0;
  pNew->nExpr = p->nExpr;
  pNew->nAlloc = p->nAlloc;
  pItem = pNew->a;
  pOldItem = p->a;
  for(i=0; i<p->nExpr; i++, pItem++, pOldItem++){
    Expr *pOldExpr = pOldItem->pExpr;
    Expr *pNewExpr;
    pItem->pExpr = sqlite3ExprDup(db, pOldExpr, flags);
    if( pOldExpr
     && pOldExpr->op==TK_SELECT_COLUMN
     && (pNewExpr = pItem->pExpr)!=0
    ){
      if( pNewExpr->pRight ){
        pPriorSelectColOld = pOldExpr->pRight;
        pPriorSelectColNew = pNewExpr->pRight;
        pNewExpr->pLeft = pNewExpr->pRight;
      }else{
        if( pOldExpr->pLeft!=pPriorSelectColOld ){
          pPriorSelectColOld = pOldExpr->pLeft;
          pPriorSelectColNew = sqlite3ExprDup(db, pPriorSelectColOld, flags);
          pNewExpr->pRight = pPriorSelectColNew;
        }
        pNewExpr->pLeft = pPriorSelectColNew;
      }
    }
    pItem->zEName = sqlite3DbStrDup(db, pOldItem->zEName);
    pItem->fg = pOldItem->fg;
    pItem->fg.done = 0;
    pItem->u = pOldItem->u;
  }
  return pNew;
}